

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_301f9a::ArgParser::argCopyAttachmentsFrom(ArgParser *this)

{
  allocator<char> local_31;
  string local_30;
  
  QPDFJob::Config::copyAttachmentsFrom((Config *)&local_30);
  std::__shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->c_copy_att).
              super___shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<QPDFJob::CopyAttConfig,_(__gnu_cxx::_Lock_policy)2> *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_30._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"copy attachment",&local_31);
  QPDFArgParser::selectOptionTable(&this->ap,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void
ArgParser::argCopyAttachmentsFrom()
{
    this->c_copy_att = c_main->copyAttachmentsFrom();
    this->ap.selectOptionTable(O_COPY_ATTACHMENT);
}